

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initialize.c
# Opt level: O0

void mesh_Initialize(Node_status *node_status,double *space_coordinate,Grid *grid)

{
  uint local_24;
  uint space_step;
  Grid *grid_local;
  double *space_coordinate_local;
  Node_status *node_status_local;
  
  *node_status = LEFT;
  node_status[grid->X_nodes - 1] = RIGHT;
  for (local_24 = 1; local_24 < grid->X_nodes - 1; local_24 = local_24 + 1) {
    node_status[local_24] = MIDDLE;
  }
  for (local_24 = 0; local_24 < grid->X_nodes; local_24 = local_24 + 1) {
    space_coordinate[local_24] = (double)local_24 * grid->X_step;
  }
  return;
}

Assistant:

void mesh_Initialize (Node_status * node_status, double * space_coordinate, Grid * grid) {
  unsigned space_step;
  node_status[0] = LEFT;
  node_status[grid->X_nodes - 1] = RIGHT;
  for (space_step = 1; space_step < grid->X_nodes - 1; ++space_step) {
    node_status[space_step] = MIDDLE;
  }

  for (space_step = 0; space_step < grid->X_nodes; ++space_step) {
    space_coordinate[space_step] = space_step * grid->X_step;
  }

  return;
}